

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

RESTResponseFormat ParseDataFormat(string *param,string *strReq)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  size_type sVar4;
  long lVar5;
  RESTResponseFormat RVar6;
  long in_FS_OFFSET;
  allocator<char> local_51;
  string suffix;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (strReq,'?',0xffffffffffffffff);
  RVar6 = UNDEF;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&suffix,strReq,0,sVar4);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (param,&suffix);
  std::__cxx11::string::~string((string *)&suffix);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (param,'.',0xffffffffffffffff);
  if (sVar4 != 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)&suffix,param,sVar4 + 1,&local_51);
    lVar2 = -0x10;
    do {
      lVar5 = lVar2;
      if (lVar5 == 0x30) {
        RVar6 = UNDEF;
        goto LAB_007cdef5;
      }
      bVar3 = std::operator==(&suffix,*(char **)((long)&rf_names[1].name + lVar5));
      lVar2 = lVar5 + 0x10;
    } while (!bVar3);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (param,sVar4,0xffffffffffffffff);
    RVar6 = *(RESTResponseFormat *)((long)&rf_names[1].rf + lVar5);
LAB_007cdef5:
    std::__cxx11::string::~string((string *)&suffix);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return RVar6;
  }
  __stack_chk_fail();
}

Assistant:

RESTResponseFormat ParseDataFormat(std::string& param, const std::string& strReq)
{
    // Remove query string (if any, separated with '?') as it should not interfere with
    // parsing param and data format
    param = strReq.substr(0, strReq.rfind('?'));
    const std::string::size_type pos_format{param.rfind('.')};

    // No format string is found
    if (pos_format == std::string::npos) {
        return rf_names[0].rf;
    }

    // Match format string to available formats
    const std::string suffix(param, pos_format + 1);
    for (const auto& rf_name : rf_names) {
        if (suffix == rf_name.name) {
            param.erase(pos_format);
            return rf_name.rf;
        }
    }

    // If no suffix is found, return RESTResponseFormat::UNDEF and original string without query string
    return rf_names[0].rf;
}